

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
test::syntax_tests::iu_PrintToTest_x_iutest_x_U32String_Test::Body
          (iu_PrintToTest_x_iutest_x_U32String_Test *this)

{
  iuCodeMessage local_1c0;
  iuStreamMessage local_190;
  
  memset(&local_190,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_190.m_stream);
  iutest::detail::iuStreamMessage::operator<<(&local_190,(char32_t (*) [5])L"TEST");
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_1c0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x418,"Succeeded.\n");
  local_1c0._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,(Fixed *)&local_190);
  std::__cxx11::string::~string((string *)&local_1c0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_190.m_stream);
  return;
}

Assistant:

IUTEST(PrintToTest, U32String)
{
    IUTEST_SUCCEED() << U"TEST";
}